

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

bool __thiscall
MemoryLeakDetector::validMemoryCorruptionInformation(MemoryLeakDetector *this,char *memory)

{
  ulong local_28;
  size_t i;
  char *memory_local;
  MemoryLeakDetector *this_local;
  
  local_28 = 0;
  while( true ) {
    if (2 < local_28) {
      return true;
    }
    if (memory[local_28] != "BAS"[local_28 % 3]) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool MemoryLeakDetector::validMemoryCorruptionInformation(char* memory)
{
   for (size_t i=0; i<memory_corruption_buffer_size; i++)
      if (memory[i] != GuardBytes[i % sizeof(GuardBytes)])
          return false;
   return true;
}